

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool CheckMerkleRoot(CBlock *block,BlockValidationState *state)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  allocator<char> local_8b;
  allocator<char> local_8a;
  bool mutated;
  string local_88;
  string local_68;
  uint256 merkle_root;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  if (block->m_checked_merkle_root == false) {
    BlockMerkleRoot((uint256 *)&merkle_root.super_base_blob<256U>,block,&mutated);
    bVar2 = operator!=(&(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>,
                       &merkle_root.super_base_blob<256U>);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"bad-txnmrklroot",&local_8a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"hashMerkleRoot mismatch",&local_8b);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                         &local_68,&local_88);
    }
    else {
      if (mutated != true) {
        block->m_checked_merkle_root = true;
        goto LAB_0036a380;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"bad-txns-duplicate",&local_8a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"duplicate transaction",&local_8b);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                         &local_68,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
LAB_0036a380:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckMerkleRoot(const CBlock& block, BlockValidationState& state)
{
    if (block.m_checked_merkle_root) return true;

    bool mutated;
    uint256 merkle_root = BlockMerkleRoot(block, &mutated);
    if (block.hashMerkleRoot != merkle_root) {
        return state.Invalid(
            /*result=*/BlockValidationResult::BLOCK_MUTATED,
            /*reject_reason=*/"bad-txnmrklroot",
            /*debug_message=*/"hashMerkleRoot mismatch");
    }

    // Check for merkle tree malleability (CVE-2012-2459): repeating sequences
    // of transactions in a block without affecting the merkle root of a block,
    // while still invalidating it.
    if (mutated) {
        return state.Invalid(
            /*result=*/BlockValidationResult::BLOCK_MUTATED,
            /*reject_reason=*/"bad-txns-duplicate",
            /*debug_message=*/"duplicate transaction");
    }

    block.m_checked_merkle_root = true;
    return true;
}